

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O0

Point3f pbrt::weightOneRing(SDVertex *vert,Float beta)

{
  undefined1 auVar1 [16];
  Tuple3<pbrt::Point3,_float> t;
  Tuple3<pbrt::Point3,_float> t_00;
  undefined1 auVar2 [16];
  Tuple3<pbrt::Point3,_float> TVar3;
  reference pvVar4;
  undefined8 uVar5;
  Point3<float> PVar6;
  Tuple3<pbrt::Point3,_float> TVar7;
  int i;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  pRing;
  int valence;
  Point3f p;
  size_type in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  float in_stack_fffffffffffffdf4;
  SDVertex *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  float in_stack_fffffffffffffe04;
  Point3f *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined8 in_stack_fffffffffffffe18;
  float in_stack_fffffffffffffe20;
  int local_144;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  local_100;
  int local_20;
  undefined8 local_c;
  float local_4;
  
  local_20 = SDVertex::valence(in_stack_fffffffffffffdf8);
  pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::Point3<float>_> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                (size_t)in_stack_fffffffffffffe08,
                (polymorphic_allocator<pbrt::Point3<float>_> *)
                CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  data(&local_100);
  SDVertex::oneRing((SDVertex *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                    in_stack_fffffffffffffe08);
  uVar5 = 0;
  t.z = in_stack_fffffffffffffe20;
  t.x = (float)(int)in_stack_fffffffffffffe18;
  t.y = (float)(int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  PVar6 = operator*(in_stack_fffffffffffffe04,t);
  TVar7.z = in_stack_fffffffffffffdf4;
  TVar7._0_8_ = in_stack_fffffffffffffdf8;
  local_4 = PVar6.super_Tuple3<pbrt::Point3,_float>.z;
  auVar2._8_8_ = uVar5;
  auVar2._0_8_ = PVar6.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_c = vmovlpd_avx(auVar2);
  for (local_144 = 0; local_144 < local_20; local_144 = local_144 + 1) {
    pvVar4 = InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
             ::operator[]((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                           *)CONCAT44(TVar7.z,in_stack_fffffffffffffdf0),in_stack_fffffffffffffde8);
    uVar5 = 0;
    t_00.z = in_stack_fffffffffffffe20;
    t_00._0_8_ = pvVar4;
    TVar7 = (Tuple3<pbrt::Point3,_float>)operator*(in_stack_fffffffffffffe04,t_00);
    in_stack_fffffffffffffe04 = (float)((ulong)uVar5 >> 0x20);
    auVar1._8_4_ = (int)uVar5;
    auVar1._0_8_ = TVar7._0_8_;
    auVar1._12_4_ = in_stack_fffffffffffffe04;
    uVar5 = vmovlpd_avx(auVar1);
    PVar6.super_Tuple3<pbrt::Point3,_float>.z = TVar7.z;
    PVar6.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar5;
    PVar6.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar5 >> 0x20);
    Tuple3<pbrt::Point3,float>::operator+=((Tuple3<pbrt::Point3,float> *)&local_c,PVar6);
  }
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  ~InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                  *)CONCAT44(TVar7.z,in_stack_fffffffffffffdf0));
  TVar3.z = local_4;
  TVar3.x = (float)(undefined4)local_c;
  TVar3.y = (float)local_c._4_4_;
  return (Point3f)TVar3;
}

Assistant:

static Point3f weightOneRing(SDVertex *vert, Float beta) {
    // Put _vert_ one-ring in _pRing_
    int valence = vert->valence();
    InlinedVector<Point3f, 16> pRing(valence);

    vert->oneRing(pRing.data());
    Point3f p = (1 - valence * beta) * vert->p;
    for (int i = 0; i < valence; ++i)
        p += beta * pRing[i];
    return p;
}